

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

void __thiscall llvm::yaml::SequenceNode::increment(SequenceNode *this)

{
  size_type *psVar1;
  SequenceType SVar2;
  pointer pcVar3;
  Token *pTVar4;
  Node *pNVar5;
  Token local_180;
  Token local_148;
  Token local_110;
  Token local_d8;
  Token local_a0;
  TokenKind TStack_68;
  undefined4 uStack_64;
  Token T;
  
  if (*(char *)(*(long *)&((((this->super_Node).Doc)->_M_t).
                           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                          stream->scanner + 0x4a) == '\x01') {
    this->IsAtEnd = true;
    this->CurrentEntry = (Node *)0x0;
    return;
  }
  if (this->CurrentEntry != (Node *)0x0) {
    (*this->CurrentEntry->_vptr_Node[1])();
  }
  pTVar4 = Scanner::peekNext(*(Scanner **)
                              &((((this->super_Node).Doc)->_M_t).
                                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                               ->stream->scanner);
  TStack_68 = pTVar4->Kind;
  uStack_64 = *(undefined4 *)&pTVar4->field_0x4;
  T.Kind = *(TokenKind *)&(pTVar4->Range).Data;
  T._4_4_ = *(undefined4 *)((long)&(pTVar4->Range).Data + 4);
  T.Range.Data = (char *)(pTVar4->Range).Length;
  psVar1 = &T.Value._M_string_length;
  pcVar3 = (pTVar4->Value)._M_dataplus._M_p;
  T.Range.Length = (size_t)psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&T.Range.Length,pcVar3,pcVar3 + (pTVar4->Value)._M_string_length);
  SVar2 = this->SeqType;
  if (SVar2 == ST_Indentless) {
    if (TStack_68 == TK_BlockEntry) {
      Scanner::getNext(&local_110,
                       *(Scanner **)
                        &((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream->scanner);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.Value._M_dataplus._M_p != &local_110.Value.field_2) {
        operator_delete(local_110.Value._M_dataplus._M_p,
                        local_110.Value.field_2._M_allocated_capacity + 1);
      }
      pNVar5 = Document::parseBlockNode
                         ((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
LAB_00dc273e:
      this->CurrentEntry = pNVar5;
      if (pNVar5 != (Node *)0x0) goto LAB_00dc2891;
    }
  }
  else if (SVar2 == ST_Flow) {
    switch(TStack_68) {
    case TK_Error:
      break;
    default:
      if (this->WasPreviousTokenFlowEntry != false) {
        pNVar5 = Document::parseBlockNode
                           ((((this->super_Node).Doc)->_M_t).
                            super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                            .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
        this->CurrentEntry = pNVar5;
        if (pNVar5 == (Node *)0x0) {
          this->IsAtEnd = true;
        }
        this->WasPreviousTokenFlowEntry = false;
        goto LAB_00dc2891;
      }
      Twine::Twine((Twine *)((long)&T.Value.field_2 + 8),"Expected , between entries!");
      Scanner::setError(*(Scanner **)
                         &((((this->super_Node).Doc)->_M_t).
                           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                          stream->scanner,(Twine *)((long)&T.Value.field_2 + 8),
                        (iterator)CONCAT44(T._4_4_,T.Kind));
      break;
    case TK_StreamEnd:
    case TK_DocumentStart:
    case TK_DocumentEnd:
      Twine::Twine((Twine *)((long)&T.Value.field_2 + 8),"Could not find closing ]!");
      Scanner::setError(*(Scanner **)
                         &((((this->super_Node).Doc)->_M_t).
                           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                          stream->scanner,(Twine *)((long)&T.Value.field_2 + 8),
                        (iterator)CONCAT44(T._4_4_,T.Kind));
      break;
    case TK_FlowEntry:
      Scanner::getNext(&local_d8,
                       *(Scanner **)
                        &((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream->scanner);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.Value._M_dataplus._M_p != &local_d8.Value.field_2) {
        operator_delete(local_d8.Value._M_dataplus._M_p,
                        local_d8.Value.field_2._M_allocated_capacity + 1);
      }
      this->WasPreviousTokenFlowEntry = true;
      increment(this);
      goto LAB_00dc2891;
    case TK_FlowSequenceEnd:
      Scanner::getNext(&local_a0,
                       *(Scanner **)
                        &((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream->scanner);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.Value._M_dataplus._M_p != &local_a0.Value.field_2) {
LAB_00dc27e3:
        operator_delete(local_a0.Value._M_dataplus._M_p,
                        local_a0.Value.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    if (SVar2 != ST_Block) goto LAB_00dc2891;
    if (TStack_68 != TK_Error) {
      if (TStack_68 == TK_BlockEnd) {
        Scanner::getNext(&local_148,
                         *(Scanner **)
                          &((((this->super_Node).Doc)->_M_t).
                            super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                            .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                           stream->scanner);
        local_a0.Value.field_2._M_allocated_capacity = local_148.Value.field_2._M_allocated_capacity
        ;
        local_a0.Value._M_dataplus._M_p = local_148.Value._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148.Value._M_dataplus._M_p != &local_148.Value.field_2) goto LAB_00dc27e3;
      }
      else {
        if (TStack_68 == TK_BlockEntry) {
          Scanner::getNext(&local_180,
                           *(Scanner **)
                            &((((this->super_Node).Doc)->_M_t).
                              super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                              .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                             stream->scanner);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180.Value._M_dataplus._M_p != &local_180.Value.field_2) {
            operator_delete(local_180.Value._M_dataplus._M_p,
                            local_180.Value.field_2._M_allocated_capacity + 1);
          }
          pNVar5 = Document::parseBlockNode
                             ((((this->super_Node).Doc)->_M_t).
                              super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                              .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
          goto LAB_00dc273e;
        }
        Twine::Twine((Twine *)((long)&T.Value.field_2 + 8),
                     "Unexpected token. Expected Block Entry or Block End.");
        Scanner::setError(*(Scanner **)
                           &((((this->super_Node).Doc)->_M_t).
                             super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                             .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                            stream->scanner,(Twine *)((long)&T.Value.field_2 + 8),
                          (iterator)CONCAT44(T._4_4_,T.Kind));
      }
    }
  }
  this->IsAtEnd = true;
  this->CurrentEntry = (Node *)0x0;
LAB_00dc2891:
  if ((size_type *)T.Range.Length != psVar1) {
    operator_delete((void *)T.Range.Length,T.Value._M_string_length + 1);
  }
  return;
}

Assistant:

void SequenceNode::increment() {
  if (failed()) {
    IsAtEnd = true;
    CurrentEntry = nullptr;
    return;
  }
  if (CurrentEntry)
    CurrentEntry->skip();
  Token T = peekNext();
  if (SeqType == ST_Block) {
    switch (T.Kind) {
    case Token::TK_BlockEntry:
      getNext();
      CurrentEntry = parseBlockNode();
      if (!CurrentEntry) { // An error occurred.
        IsAtEnd = true;
        CurrentEntry = nullptr;
      }
      break;
    case Token::TK_BlockEnd:
      getNext();
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      setError( "Unexpected token. Expected Block Entry or Block End."
              , T);
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  } else if (SeqType == ST_Indentless) {
    switch (T.Kind) {
    case Token::TK_BlockEntry:
      getNext();
      CurrentEntry = parseBlockNode();
      if (!CurrentEntry) { // An error occurred.
        IsAtEnd = true;
        CurrentEntry = nullptr;
      }
      break;
    default:
    case Token::TK_Error:
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  } else if (SeqType == ST_Flow) {
    switch (T.Kind) {
    case Token::TK_FlowEntry:
      // Eat the flow entry and recurse.
      getNext();
      WasPreviousTokenFlowEntry = true;
      return increment();
    case Token::TK_FlowSequenceEnd:
      getNext();
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      // Set this to end iterator.
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    case Token::TK_StreamEnd:
    case Token::TK_DocumentEnd:
    case Token::TK_DocumentStart:
      setError("Could not find closing ]!", T);
      // Set this to end iterator.
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      if (!WasPreviousTokenFlowEntry) {
        setError("Expected , between entries!", T);
        IsAtEnd = true;
        CurrentEntry = nullptr;
        break;
      }
      // Otherwise it must be a flow entry.
      CurrentEntry = parseBlockNode();
      if (!CurrentEntry) {
        IsAtEnd = true;
      }
      WasPreviousTokenFlowEntry = false;
      break;
    }
  }
}